

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O3

void communicate(int descriptor,Arguments *args)

{
  __pid_t _Var1;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    client_communicate(descriptor,args);
    close(descriptor);
    return;
  }
  if (_Var1 != -1) {
    server_communicate(descriptor,args);
    return;
  }
  throw("Error forking process");
}

Assistant:

void communicate(int descriptor, struct Arguments* args) {
	// File descriptors can only be shared bewteen related processes,
	// therefore we will need to fork this process
	pid_t pid;

	// Fork a child process
	if ((pid = fork()) == -1) {
		throw("Error forking process");
	}

	// fork() returns 0 for the child process
	if (pid == (pid_t)0) {
		client_communicate(descriptor, args);
		close(descriptor);
	} else {
		server_communicate(descriptor, args);
	}
}